

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall hdc::Driver::generateIR(Driver *this)

{
  return;
}

Assistant:

void Driver::generateIR() {
/*    IRBuilderVisitor builder;
    IRProgram* program;
    std::map<std::string, SourceFile*>::iterator it;

    std::cout << "\nGenerating Intermediate Representation...\n\n";

    for (it = sourceFiles.begin(); it != sourceFiles.end(); ++it) {
        it->second->accept(&builder);
    }

    IRPrettyPrinter pp;
    program = builder.getIRProgram();

    program->accept(&pp);

    std::cout << pp.getOutput();
    delete program;*/
}